

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# initdsp.c
# Opt level: O0

void init_display2(DLword *display_addr,uint display_max)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  uint display_max_local;
  DLword *display_addr_local;
  
  DisplayRegion68k = display_addr;
  (*(currentdsp->device).enter)(currentdsp);
  displaywidth = (currentdsp->Display).width;
  displayheight = (currentdsp->Display).height;
  DisplayRasterWidth = displaywidth >> 4;
  if (display_max < displaywidth * displayheight) {
    displayheight = display_max / displaywidth;
  }
  DISP_MAX_Address = DisplayRegion68k + DisplayRasterWidth * displayheight;
  DisplayType = 0x10;
  DisplayRegion68k_end_addr = DisplayRegion68k + DisplayRasterWidth * displayheight;
  init_cursor();
  uVar1 = displaywidth * displayheight;
  iVar2 = getpagesize();
  iVar3 = getpagesize();
  DisplayByteSize = (uVar1 >> 3) + iVar2 + -1 & -iVar3;
  clear_display();
  return;
}

Assistant:

void init_display2(DLword *display_addr, unsigned display_max)
{



  DisplayRegion68k = (DLword *)display_addr;


#if (defined(XWINDOW) || defined(DOS))
  (currentdsp->device.enter)(currentdsp);
  displaywidth = currentdsp->Display.width;
  displayheight = currentdsp->Display.height;
#endif /* XWINDOW */
#if (defined(SDL))
  displaywidth = sdl_displaywidth;
  displayheight = sdl_displayheight;
#endif /* SDL */
  DisplayRasterWidth = displaywidth / BITSPER_DLWORD;

  if ((displaywidth * displayheight) > display_max) { displayheight = display_max / displaywidth; }
  DISP_MAX_Address = DisplayRegion68k + DisplayRasterWidth * displayheight;
  DBPRINT(("FBIOGTYPE w x h = %d x %d\n", displaywidth, displayheight));

  DBPRINT(("FBIOGTYPE w x h = %d x %d\n", displaywidth, displayheight));


#ifdef XWINDOW
  DisplayType = SUN2BW;
  DisplayRegion68k_end_addr = DisplayRegion68k + DisplayRasterWidth * displayheight;
#endif /* XWINDOW */
#ifdef SDL
  DisplayType = SUN2BW;
#endif /* SDL */
  init_cursor();
  DisplayByteSize = ((displaywidth * displayheight / 8 + ((unsigned)getpagesize() - 1)) & (unsigned)-getpagesize());

  DBPRINT(("Display address: %p\n", (void *)DisplayRegion68k));
  DBPRINT(("        length : 0x%x\n", DisplayByteSize));
  DBPRINT(("        pg size: 0x%x\n", getpagesize()));


#ifdef DOS
  (currentdsp->cleardisplay)(currentdsp);
#else  /* DOS */
  clear_display();
#endif /* DOS */

  DBPRINT(("after clear_display()\n"));


  DBPRINT(("exiting init_display\n"));
}